

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

bool llvm::sys::path::has_relative_path(Twine *path,Style style)

{
  StringRef path_00;
  StringRef SVar1;
  SmallString<128U> path_storage;
  SmallVectorImpl<char> local_b8;
  undefined1 local_a8 [128];
  
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_a8;
  path_00 = Twine::toStringRef(path,&local_b8);
  SVar1 = root_path(path_00,style);
  if ((undefined1 *)
      local_b8.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_a8) {
    free(local_b8.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return SVar1.Length < path_00.Length;
}

Assistant:

bool has_relative_path(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !relative_path(p, style).empty();
}